

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

CursorType * __thiscall
duckdb::QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
          (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *this,
          WindowPartitionInput *partition)

{
  _Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false> __p;
  pointer in_RAX;
  type pQVar1;
  _Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  if ((this->window_cursor).
      super_unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
      .super__Head_base<0UL,_duckdb::QuantileCursor<duckdb::hugeint_t>_*,_false>._M_head_impl ==
      (QuantileCursor<duckdb::hugeint_t> *)0x0) {
    make_uniq<duckdb::QuantileCursor<duckdb::hugeint_t>,duckdb::WindowPartitionInput_const&>
              ((duckdb *)&local_18,partition);
    __p._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
    ::reset((__uniq_ptr_impl<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
             *)&this->window_cursor,__p._M_head_impl);
    ::std::
    unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
    ::~unique_ptr((unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>_>
                   *)&local_18);
  }
  pQVar1 = unique_ptr<duckdb::QuantileCursor<duckdb::hugeint_t>,_std::default_delete<duckdb::QuantileCursor<duckdb::hugeint_t>_>,_true>
           ::operator*(&this->window_cursor);
  return pQVar1;
}

Assistant:

CursorType &GetOrCreateWindowCursor(const WindowPartitionInput &partition) {
		if (!window_cursor) {
			window_cursor = make_uniq<CursorType>(partition);
		}
		return *window_cursor;
	}